

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::ScopeRandomizeFunction::checkArguments
          (ScopeRandomizeFunction *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_5)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  string_view arg_00;
  SourceRange callRange;
  bool bVar1;
  Compilation *this_00;
  reference ppEVar2;
  Symbol *pSVar3;
  Type *pTVar4;
  size_t in_RCX;
  SourceLocation in_RDI;
  size_t in_R8;
  DeclaredType *dt;
  Symbol *sym;
  Expression *arg;
  iterator __end3;
  iterator __begin3;
  Args *__range3;
  Compilation *comp;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *this_01;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  *__lhs;
  Type *in_stack_ffffffffffffff18;
  Diagnostic *in_stack_ffffffffffffff28;
  SourceLocation in_stack_ffffffffffffff30;
  basic_string_view<char,_std::char_traits<char>_> in_stack_ffffffffffffff40;
  SourceLocation in_stack_ffffffffffffff50;
  SourceLocation in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar5;
  Args *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined1 isMethod;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  SystemSubroutine *in_stack_ffffffffffffff88;
  SourceLocation in_stack_ffffffffffffff90;
  Expression *pEVar6;
  SourceLocation in_stack_ffffffffffffff98;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_60 [2];
  Type *local_8;
  
  isMethod = (undefined1)((ulong)in_stack_ffffffffffffff78 >> 0x38);
  this_00 = ASTContext::getCompilation((ASTContext *)0xb0e9f1);
  this_01 = (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0x0;
  __lhs = (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
           *)0x7fffffff;
  callRange.endLoc = in_stack_ffffffffffffff98;
  callRange.startLoc = in_stack_ffffffffffffff90;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_stack_ffffffffffffff88,
                     (ASTContext *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (bool)isMethod,in_stack_ffffffffffffff70,callRange,in_RCX,in_R8);
  if (bVar1) {
    local_60[0]._M_current =
         (Expression **)
         std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin(this_01);
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
               in_stack_ffffffffffffff18);
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             (__lhs,(__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                                     *)this_01), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppEVar2 = __gnu_cxx::
                __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                ::operator*(local_60);
      pEVar6 = *ppEVar2;
      pSVar3 = Expression::getSymbolReference
                         ((Expression *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50._7_1_);
      if ((pSVar3 == (Symbol *)0x0) || (pEVar6->kind != NamedValue)) {
        sourceRange.endLoc = in_RDI;
        sourceRange.startLoc = in_stack_ffffffffffffff30;
        ASTContext::addDiag((ASTContext *)in_stack_ffffffffffffff28,
                            in_stack_ffffffffffffff40._M_len._4_4_,sourceRange);
        pTVar4 = Compilation::getErrorType(this_00);
        return pTVar4;
      }
      Symbol::getDeclaredType(&in_stack_ffffffffffffff18->super_Symbol);
      in_stack_ffffffffffffff30 =
           (SourceLocation)
           DeclaredType::getType
                     ((DeclaredType *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
      ;
      Compilation::languageVersion((Compilation *)0xb0eba3);
      bVar1 = Type::isValidForRand
                        (in_stack_ffffffffffffff18,(RandMode)((ulong)__lhs >> 0x20),
                         (LanguageVersion)__lhs);
      if (!bVar1) {
        uVar5 = 0x610006;
        in_stack_ffffffffffffff50 = (pEVar6->sourceRange).startLoc;
        in_stack_ffffffffffffff58 = (pEVar6->sourceRange).endLoc;
        sourceRange_00.endLoc = in_RDI;
        sourceRange_00.startLoc = in_stack_ffffffffffffff30;
        ASTContext::addDiag((ASTContext *)in_stack_ffffffffffffff28,
                            in_stack_ffffffffffffff40._M_len._4_4_,sourceRange_00);
        DeclaredType::getType
                  ((DeclaredType *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        in_stack_ffffffffffffff28 =
             ast::operator<<((Diagnostic *)CONCAT44(uVar5,in_stack_ffffffffffffff60),
                             (Type *)in_stack_ffffffffffffff58);
        in_stack_ffffffffffffff40 = sv((char *)__lhs,(size_t)this_01);
        arg_00._M_str._0_4_ = in_stack_ffffffffffffff60;
        arg_00._M_len = (size_t)in_stack_ffffffffffffff58;
        arg_00._M_str._4_4_ = uVar5;
        Diagnostic::operator<<((Diagnostic *)in_stack_ffffffffffffff50,arg_00);
      }
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ::operator++(local_60);
    }
    local_8 = Compilation::getIntType(this_00);
  }
  else {
    local_8 = Compilation::getErrorType(this_00);
  }
  return local_8;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 0, INT32_MAX))
            return comp.getErrorType();

        for (auto arg : args) {
            auto sym = arg->getSymbolReference();
            if (!sym || arg->kind != ExpressionKind::NamedValue) {
                context.addDiag(diag::ExpectedVariableName, arg->sourceRange);
                return comp.getErrorType();
            }

            auto dt = sym->getDeclaredType();
            SLANG_ASSERT(dt);
            if (!dt->getType().isValidForRand(RandMode::Rand, comp.languageVersion())) {
                context.addDiag(diag::InvalidRandType, arg->sourceRange)
                    << dt->getType() << "rand"sv;
            }
        }

        return comp.getIntType();
    }